

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

TidyMessageImpl *
formatEncodingReport
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  ctmbstr ptVar4;
  ctmbstr ptVar5;
  TidyMessageImpl *pTVar6;
  ulong uVar7;
  uint encoding;
  uint messageType;
  char buf [32];
  tmbchar local_48 [32];
  
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  uVar2 = args->gp_offset;
  uVar7 = (ulong)uVar2;
  if (uVar7 < 0x29) {
    args->gp_offset = (uint)(uVar7 + 8);
    encoding = *(uint *)((long)args->reg_save_area + uVar7);
    if (0x20 < uVar2) goto LAB_00153b36;
    piVar3 = (int *)(uVar7 + 8 + (long)args->reg_save_area);
    args->gp_offset = uVar2 + 0x10;
  }
  else {
    puVar1 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar1 + 2;
    encoding = *puVar1;
LAB_00153b36:
    piVar3 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar3 + 2;
  }
  messageType = 0x1f7;
  if (*piVar3 == 0) {
    messageType = 0x1fd;
  }
  ptVar4 = tidyLocalizedString(messageType);
  switch(code) {
  case 0x249:
    NtoS(encoding,local_48);
    uVar2 = 0x40;
    break;
  case 0x24a:
    NtoS(encoding,local_48);
    uVar2 = 2;
    break;
  case 0x24b:
    prvTidytmbsnprintf(local_48,0x20,"U+%04X",(ulong)encoding);
    uVar2 = 4;
    break;
  case 0x24c:
    prvTidytmbsnprintf(local_48,0x20,"U+%04X",(ulong)encoding);
    uVar2 = 8;
    break;
  default:
    if (code == 0x23b) {
      *(byte *)&doc->badChars = (byte)doc->badChars | 0x10;
      ptVar4 = prvTidyCharEncodingName(doc->docIn->encoding);
      ptVar5 = prvTidyCharEncodingName(encoding);
      pTVar6 = prvTidytidyMessageCreateWithLexer(doc,0x23b,level,ptVar4,ptVar5);
      return pTVar6;
    }
    if (code != 0x28f) goto LAB_00153c4f;
    NtoS(encoding,local_48);
    uVar2 = 1;
  }
  doc->badChars = doc->badChars | uVar2;
LAB_00153c4f:
  pTVar6 = prvTidytidyMessageCreateWithLexer(doc,code,level,ptVar4,local_48);
  return pTVar6;
}

Assistant:

TidyMessageImpl *formatEncodingReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char buf[ 32 ] = {'\0'};
    uint c = va_arg( args, uint );
    Bool discarded = va_arg( args, Bool );
    ctmbstr action = tidyLocalizedString(discarded ? STRING_DISCARDING : STRING_REPLACING);

    switch (code)
    {
        case INVALID_NCR:
            NtoS(c, buf);
            doc->badChars |= BC_INVALID_NCR;
            break;

        case INVALID_SGML_CHARS:
            NtoS(c, buf);
            doc->badChars |= BC_INVALID_SGML_CHARS;
            break;

        case INVALID_UTF8:
            TY_(tmbsnprintf)(buf, sizeof(buf), "U+%04X", c);
            doc->badChars |= BC_INVALID_UTF8;
            break;

        case INVALID_UTF16:
            TY_(tmbsnprintf)(buf, sizeof(buf), "U+%04X", c);
            doc->badChars |= BC_INVALID_UTF16;
            break;

        case VENDOR_SPECIFIC_CHARS:
            NtoS(c, buf);
            doc->badChars |= BC_VENDOR_SPECIFIC_CHARS;
            break;

        case ENCODING_MISMATCH:
            doc->badChars |= BC_ENCODING_MISMATCH;
            return TY_(tidyMessageCreateWithLexer)(doc,
                                                   code,
                                                   level,
                                                   TY_(CharEncodingName)(doc->docIn->encoding),
                                                   TY_(CharEncodingName)(c));
            break;
    }

    return TY_(tidyMessageCreateWithLexer)(doc, code, level, action, buf );

}